

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O1

void ncnn::im2col_sgemm_pack8to1_int8_sse_xop
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  int *piVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  void *pvVar18;
  undefined1 (*pauVar19) [16];
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  int nn;
  undefined8 *puVar26;
  int iVar27;
  undefined4 *puVar28;
  undefined8 *puVar29;
  uint uVar30;
  undefined4 *puVar31;
  long lVar32;
  undefined4 *puVar33;
  ulong uVar34;
  undefined4 *puVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  Mat local_b8;
  Mat *local_70;
  Mat *local_68;
  undefined1 (*local_60) [16];
  ulong local_58;
  ulong local_50;
  long local_48;
  long local_40;
  void *local_38;
  
  uVar1 = bottom_im2col->w;
  uVar21 = (ulong)(int)uVar1;
  iVar20 = bottom_im2col->h;
  uVar15 = bottom_im2col->c;
  iVar2 = top_blob->c;
  uVar34 = (ulong)iVar2;
  local_b8.cstep = 0;
  local_b8.elemsize = 0;
  local_b8.elempack = 0;
  local_b8.data = (undefined1 (*) [16])0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  local_b8.allocator = (Allocator *)0x0;
  local_b8.dims = 0;
  local_b8.w = 0;
  uVar23 = (uVar1 & 1) + (uVar1 >> 1);
  if ((long)uVar21 < 2) {
    uVar23 = uVar1;
  }
  local_70 = top_blob;
  local_68 = kernel;
  Mat::create(&local_b8,iVar20 << (1 < (long)uVar21),uVar15,uVar23,8,8,opt->workspace_allocator);
  if (0 < (int)uVar1 >> 1) {
    lVar17 = 0;
    uVar22 = 0;
    do {
      if (0 < (int)uVar15) {
        puVar29 = (undefined8 *)
                  ((undefined1 *)local_b8.data + local_b8.cstep * uVar22 * local_b8.elemsize);
        uVar25 = 0;
        do {
          if (0 < iVar20) {
            puVar26 = (undefined8 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar25 + lVar17);
            iVar27 = iVar20;
            do {
              uVar13 = puVar26[1];
              *puVar29 = *puVar26;
              puVar29[1] = uVar13;
              puVar29 = puVar29 + 2;
              puVar26 = puVar26 + uVar21;
              iVar27 = iVar27 + -1;
            } while (iVar27 != 0);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar15);
      }
      uVar22 = uVar22 + 1;
      lVar17 = lVar17 + 0x10;
    } while (uVar22 != (uint)((int)uVar1 >> 1));
  }
  uVar22 = uVar21 & 0xfffffffffffffffe;
  if ((uint)uVar22 != uVar1) {
    pvVar18 = (void *)(uVar22 * 8 + (long)bottom_im2col->data);
    do {
      if (0 < (int)uVar15) {
        uVar23 = ((uint)(uVar22 >> 0x1f) & 1) + (int)uVar22;
        puVar29 = (undefined8 *)
                  ((undefined1 *)local_b8.data +
                  (long)(int)(((int)uVar23 >> 1) + ((int)uVar22 - (uVar23 & 0xfffffffe))) *
                  local_b8.cstep * local_b8.elemsize);
        uVar25 = 0;
        do {
          if (0 < iVar20) {
            puVar26 = (undefined8 *)
                      (bottom_im2col->cstep * bottom_im2col->elemsize * uVar25 + (long)pvVar18);
            iVar27 = iVar20;
            do {
              *puVar29 = *puVar26;
              puVar29 = puVar29 + 1;
              puVar26 = puVar26 + uVar21;
              iVar27 = iVar27 + -1;
            } while (iVar27 != 0);
          }
          uVar25 = uVar25 + 1;
        } while (uVar25 != uVar15);
      }
      uVar22 = uVar22 + 1;
      pvVar18 = (void *)((long)pvVar18 + 8);
    } while ((long)uVar22 < (long)uVar21);
  }
  if (0 < iVar2 >> 2) {
    local_38 = local_70->data;
    local_40 = local_70->elemsize * local_70->cstep;
    local_60 = (undefined1 (*) [16])local_b8.data;
    pauVar24 = (undefined1 (*) [16])local_68->data;
    local_48 = local_68->elemsize * local_68->cstep;
    local_50 = (ulong)(uint)(iVar2 >> 2);
    uVar22 = 0;
    do {
      puVar31 = (undefined4 *)(uVar22 * 4 * local_40 + (long)local_38);
      puVar35 = (undefined4 *)((uVar22 * 4 + 1) * local_40 + (long)local_38);
      puVar33 = (undefined4 *)((uVar22 * 4 + 2) * local_40 + (long)local_38);
      puVar28 = (undefined4 *)((uVar22 * 4 + 3) * local_40 + (long)local_38);
      if ((int)uVar1 < 2) {
        uVar25 = 0;
      }
      else {
        uVar16 = 0;
        pauVar19 = (undefined1 (*) [16])local_b8.data;
        do {
          if (0 < (int)(uVar15 * iVar20)) {
            auVar39 = *pauVar19;
            auVar36 = vpcmpgtb_avx((undefined1  [16])0x0,auVar39);
            vpunpcklbw_avx(auVar39,auVar36);
            vpunpckhbw_avx(auVar39,auVar36);
            auVar39 = *pauVar24;
            auVar36 = pauVar24[1];
            auVar6 = vpcmpgtb_avx((undefined1  [16])0x0,auVar39);
            auVar7 = vpcmpgtb_avx((undefined1  [16])0x0,auVar36);
            vpunpcklbw_avx(auVar39,auVar6);
            vpunpckhbw_avx(auVar39,auVar6);
            vpunpcklbw_avx(auVar36,auVar7);
            vpunpckhbw_avx(auVar36,auVar7);
            halt_baddata();
          }
          auVar39 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar9 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar36 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar6 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar10 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar11 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar7 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar8 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar12 = vpunpcklqdq_avx(auVar39,auVar9);
          auVar39 = vpunpckhqdq_avx(auVar39,auVar9);
          auVar39 = vpaddd_avx(auVar12,auVar39);
          auVar9 = vpunpcklqdq_avx(auVar36,auVar6);
          auVar36 = vpunpckhqdq_avx(auVar36,auVar6);
          auVar36 = vpaddd_avx(auVar36,auVar9);
          auVar39 = vpaddd_avx(auVar39,auVar36);
          auVar6 = vpunpcklqdq_avx(auVar10,auVar11);
          auVar36 = vpunpckhqdq_avx(auVar10,auVar11);
          auVar36 = vpaddd_avx(auVar6,auVar36);
          auVar6 = vpunpcklqdq_avx(auVar7,auVar8);
          *puVar31 = auVar39._0_4_;
          *puVar35 = auVar39._4_4_;
          *puVar33 = auVar39._8_4_;
          *puVar28 = auVar39._12_4_;
          auVar39 = vpunpckhqdq_avx(auVar7,auVar8);
          auVar39 = vpaddd_avx(auVar39,auVar6);
          auVar39 = vpaddd_avx(auVar36,auVar39);
          puVar31[1] = auVar39._0_4_;
          puVar35[1] = auVar39._4_4_;
          puVar33[1] = auVar39._8_4_;
          puVar28[1] = auVar39._12_4_;
          puVar31 = puVar31 + 2;
          puVar35 = puVar35 + 2;
          puVar33 = puVar33 + 2;
          puVar28 = puVar28 + 2;
          uVar25 = uVar16 + 2;
          lVar17 = uVar16 + 3;
          pauVar19 = (undefined1 (*) [16])(*pauVar19 + local_b8.elemsize * local_b8.cstep);
          uVar16 = uVar25;
        } while (lVar17 < (long)uVar21);
      }
      if ((int)uVar25 < (int)uVar1) {
        do {
          if (0 < (int)(uVar15 * iVar20)) {
            auVar39._8_8_ = 0;
            auVar39._0_8_ =
                 *(ulong *)((undefined1 *)local_b8.data +
                           (ulong)(((uint)uVar25 & 1) + ((uint)(uVar25 >> 1) & 0x7fffffff)) *
                           local_b8.elemsize * local_b8.cstep);
            vpmovsxbw_avx(auVar39);
            auVar39 = *pauVar24;
            auVar36 = pauVar24[1];
            auVar6 = vpcmpgtb_avx((undefined1  [16])0x0,auVar39);
            auVar7 = vpcmpgtb_avx((undefined1  [16])0x0,auVar36);
            vpunpcklbw_avx(auVar39,auVar6);
            vpunpckhbw_avx(auVar39,auVar6);
            vpunpcklbw_avx(auVar36,auVar7);
            vpunpckhbw_avx(auVar36,auVar7);
            halt_baddata();
          }
          auVar39 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar7 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar36 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar6 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
          auVar8 = vpunpcklqdq_avx(auVar39,auVar7);
          auVar39 = vpunpckhqdq_avx(auVar39,auVar7);
          auVar39 = vpaddd_avx(auVar8,auVar39);
          auVar7 = vpunpcklqdq_avx(auVar36,auVar6);
          auVar36 = vpunpckhqdq_avx(auVar36,auVar6);
          auVar36 = vpaddd_avx(auVar36,auVar7);
          auVar39 = vpaddd_avx(auVar39,auVar36);
          *puVar31 = auVar39._0_4_;
          *puVar35 = auVar39._4_4_;
          *puVar33 = auVar39._8_4_;
          *puVar28 = auVar39._12_4_;
          puVar31 = puVar31 + 1;
          puVar35 = puVar35 + 1;
          puVar33 = puVar33 + 1;
          puVar28 = puVar28 + 1;
          uVar23 = (uint)uVar25 + 1;
          uVar25 = (ulong)uVar23;
        } while (uVar23 != uVar1);
      }
      uVar22 = uVar22 + 1;
      pauVar24 = (undefined1 (*) [16])(*pauVar24 + local_48);
    } while (uVar22 != local_50);
  }
  uVar22 = uVar34 & 0xfffffffffffffffc;
  if ((int)uVar22 != iVar2) {
    pvVar18 = local_70->data;
    sVar3 = local_70->elemsize;
    sVar4 = local_70->cstep;
    pvVar5 = local_68->data;
    lVar17 = local_68->elemsize * local_68->cstep;
    iVar20 = uVar15 * iVar20;
    do {
      puVar29 = (undefined8 *)(sVar3 * sVar4 * uVar22 + (long)pvVar18);
      uVar15 = (uint)uVar22;
      if ((int)uVar1 < 2) {
        uVar25 = 0;
      }
      else {
        uVar23 = uVar15 + 3;
        if (-1 < (int)uVar15) {
          uVar23 = uVar15;
        }
        uVar16 = 0;
        do {
          if (iVar20 < 1) {
            auVar39 = (undefined1  [16])0x0;
            auVar36 = (undefined1  [16])0x0;
          }
          else {
            pauVar24 = (undefined1 (*) [16])
                       ((undefined1 *)local_b8.data +
                       (uVar16 >> 1) * local_b8.elemsize * local_b8.cstep);
            auVar37 = ZEXT1664((undefined1  [16])0x0);
            lVar32 = 0;
            auVar38 = ZEXT1664((undefined1  [16])0x0);
            auVar40 = ZEXT1664((undefined1  [16])0x0);
            auVar41 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar39 = *pauVar24;
              auVar6 = vpcmpgtb_avx((undefined1  [16])0x0,auVar39);
              auVar7 = vpunpcklbw_avx(auVar39,auVar6);
              auVar36._8_8_ = 0;
              auVar36._0_8_ =
                   *(ulong *)((long)pvVar5 +
                             lVar32 * 8 +
                             (int)(((int)uVar23 >> 2) + (uVar15 - (uVar23 & 0xfffffffc))) * lVar17);
              auVar36 = vpmovsxbw_avx(auVar36);
              auVar39 = vpunpckhbw_avx(auVar39,auVar6);
              auVar8 = vpmullw_avx(auVar36,auVar7);
              auVar6 = vpmulhw_avx(auVar36,auVar7);
              auVar9 = vpmullw_avx(auVar36,auVar39);
              auVar7 = vpmulhw_avx(auVar36,auVar39);
              auVar39 = vpunpcklwd_avx(auVar8,auVar6);
              auVar39 = vpaddd_avx(auVar39,auVar41._0_16_);
              auVar41 = ZEXT1664(auVar39);
              auVar36 = vpunpckhwd_avx(auVar8,auVar6);
              auVar36 = vpaddd_avx(auVar40._0_16_,auVar36);
              auVar40 = ZEXT1664(auVar36);
              auVar6 = vpunpcklwd_avx(auVar9,auVar7);
              auVar6 = vpaddd_avx(auVar38._0_16_,auVar6);
              auVar38 = ZEXT1664(auVar6);
              auVar7 = vpunpckhwd_avx(auVar9,auVar7);
              auVar7 = vpaddd_avx(auVar37._0_16_,auVar7);
              auVar37 = ZEXT1664(auVar7);
              pauVar24 = pauVar24 + 1;
              lVar32 = lVar32 + 1;
            } while (iVar20 != (int)lVar32);
            auVar39 = vpaddd_avx(auVar36,auVar39);
            auVar36 = vpaddd_avx(auVar7,auVar6);
          }
          auVar6 = vpshufd_avx(auVar39,0xee);
          auVar39 = vpaddd_avx(auVar39,auVar6);
          auVar6 = vpshufd_avx(auVar36,0xee);
          auVar36 = vpaddd_avx(auVar36,auVar6);
          auVar39 = vphaddd_avx(auVar39,auVar36);
          auVar39 = vpshufd_avx(auVar39,0xe8);
          *puVar29 = auVar39._0_8_;
          puVar29 = puVar29 + 1;
          uVar25 = uVar16 + 2;
          lVar32 = uVar16 + 3;
          uVar16 = uVar25;
        } while (lVar32 < (long)uVar21);
      }
      if ((int)uVar25 < (int)uVar1) {
        uVar23 = uVar15 + 3;
        if (-1 < (int)uVar15) {
          uVar23 = uVar15;
        }
        do {
          if (iVar20 < 1) {
            auVar39 = (undefined1  [16])0x0;
          }
          else {
            auVar37 = ZEXT1664((undefined1  [16])0x0);
            lVar32 = 0;
            auVar38 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar6._8_8_ = 0;
              auVar6._0_8_ = *(ulong *)((undefined1 *)local_b8.data +
                                       lVar32 * 8 +
                                       (ulong)(((uint)uVar25 & 1) +
                                              ((uint)(uVar25 >> 1) & 0x7fffffff)) *
                                       local_b8.elemsize * local_b8.cstep);
              auVar39 = vpmovsxbw_avx(auVar6);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = *(ulong *)((long)pvVar5 +
                                       lVar32 * 8 +
                                       (int)(((int)uVar23 >> 2) + (uVar15 - (uVar23 & 0xfffffffc)))
                                       * lVar17);
              auVar36 = vpmovsxbw_avx(auVar7);
              auVar6 = vpmullw_avx(auVar36,auVar39);
              auVar36 = vpmulhw_avx(auVar39,auVar36);
              auVar39 = vpunpcklwd_avx(auVar6,auVar36);
              auVar39 = vpaddd_avx(auVar38._0_16_,auVar39);
              auVar38 = ZEXT1664(auVar39);
              auVar36 = vpunpckhwd_avx(auVar6,auVar36);
              auVar36 = vpaddd_avx(auVar37._0_16_,auVar36);
              auVar37 = ZEXT1664(auVar36);
              lVar32 = lVar32 + 1;
            } while (iVar20 != (int)lVar32);
            auVar39 = vpaddd_avx(auVar36,auVar39);
          }
          auVar39 = vphaddd_avx(auVar39,auVar39);
          auVar39 = vphaddd_avx(auVar39,auVar39);
          *(int *)puVar29 = auVar39._0_4_;
          puVar29 = (undefined8 *)((long)puVar29 + 4);
          uVar30 = (uint)uVar25 + 1;
          uVar25 = (ulong)uVar30;
        } while (uVar30 != uVar1);
      }
      uVar22 = uVar22 + 1;
    } while ((long)uVar22 < (long)uVar34);
  }
  piVar14 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      local_58 = uVar34;
      if (local_b8.allocator == (Allocator *)0x0) {
        if ((undefined1 (*) [16])local_b8.data != (undefined1 (*) [16])0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void im2col_sgemm_pack8to1_int8_sse_xop(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to1_int8_sse(bottom_im2col, top_blob, kernel, opt);
}